

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O3

bool box_x_compare(shared_ptr<hittable> *a,shared_ptr<hittable> *b)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar3;
  double dVar4;
  int iVar5;
  aabb box_b;
  aabb box_a;
  double local_78 [12];
  
  peVar1 = (a->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (a->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  peVar2 = (b->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (b->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_78[10] = 0.0;
  local_78[0xb] = 0.0;
  local_78[8] = 0.0;
  local_78[9] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  iVar5 = (*peVar1->_vptr_hittable[1])(0,0);
  if ((char)iVar5 != '\0') {
    iVar5 = (*peVar2->_vptr_hittable[1])(0,0,peVar2,local_78);
    if ((char)iVar5 != '\0') goto LAB_001058b8;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No bounding box in bvh_node constructor.\n",0x29);
LAB_001058b8:
  dVar4 = local_78[6];
  dVar3 = local_78[0];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return dVar4 < dVar3;
}

Assistant:

bool box_x_compare (const shared_ptr<hittable> a, const shared_ptr<hittable> b) {
    return box_compare(a, b, 0);
}